

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExitNode.cpp
# Opt level: O0

bool __thiscall ExitNode::removeJoinSuccessor(ExitNode *this,JoinNode *joinNode)

{
  size_type sVar1;
  long in_RSI;
  set<const_ExitNode_*,_std::less<const_ExitNode_*>,_std::allocator<const_ExitNode_*>_> *in_RDI;
  set<JoinNode_*,_std::less<JoinNode_*>,_std::allocator<JoinNode_*>_> *in_stack_ffffffffffffffe0;
  undefined1 local_1;
  
  if (in_RSI == 0) {
    local_1 = false;
  }
  else {
    std::set<JoinNode_*,_std::less<JoinNode_*>,_std::allocator<JoinNode_*>_>::erase
              (in_stack_ffffffffffffffe0,(key_type *)in_RDI);
    sVar1 = std::
            set<const_ExitNode_*,_std::less<const_ExitNode_*>,_std::allocator<const_ExitNode_*>_>::
            erase(in_RDI,(key_type *)in_RDI);
    local_1 = sVar1 != 0;
  }
  return local_1;
}

Assistant:

bool ExitNode::removeJoinSuccessor(JoinNode *joinNode) {
    if (!joinNode) {
        return false;
    }
    joinSuccessors_.erase(joinNode);
    return joinNode->joinPredecessors_.erase(this);
}